

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O1

void qt_alphamapblit_argb32
               (QRasterBuffer *rasterBuffer,int x,int y,QRgba64 *color,uchar *map,int mapWidth,
               int mapHeight,int mapStride,QClipData *clip,bool useGammaCorrection)

{
  _Head_base<0UL,_unsigned_short_*,_false> _Var1;
  long lVar2;
  uchar *puVar3;
  QT_FT_Span *pQVar4;
  uint uVar5;
  int iVar6;
  uint c;
  QColorTrcLut *colorProfile;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  long lVar10;
  uchar *puVar11;
  int iVar12;
  quint32 *dest;
  long lVar13;
  ClipLine *pCVar14;
  long in_FS_OFFSET;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  QRgba64 srcColor;
  QRgba64 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  c = QRgba64::toArgb32(color);
  if (*(short *)((long)&color->rgba + 6) != 0) {
    uVar8 = rasterBuffer->bytes_per_line;
    if (useGammaCorrection) {
      colorProfile = QGuiApplicationPrivate::colorProfileForA8Text(QGuiApplicationPrivate::self);
    }
    else {
      colorProfile = (QColorTrcLut *)0x0;
    }
    local_40 = (QRgba64)color->rgba;
    uVar15 = (ushort)(local_40.rgba >> 0x30);
    if (uVar15 == 0xffff && colorProfile != (QColorTrcLut *)0x0) {
      _Var1._M_head_impl =
           (colorProfile->m_toLinear)._M_t.
           super___uniq_ptr_impl<unsigned_short,_std::default_delete<unsigned_short[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_short_*,_std::default_delete<unsigned_short[]>_>.
           super__Head_base<0UL,_unsigned_short_*,_false>._M_head_impl;
      uVar16 = (ushort)(local_40.rgba >> 0x10);
      uVar17 = (ushort)(local_40.rgba >> 0x20);
      uVar15 = uVar15 - (uVar15 >> 8);
      local_40.rgba =
           CONCAT26((uVar15 >> 8) + uVar15,
                    CONCAT24((_Var1._M_head_impl[(ushort)(uVar17 - (uVar17 >> 8)) >> 4] >> 8) +
                             _Var1._M_head_impl[(ushort)(uVar17 - (uVar17 >> 8)) >> 4],
                             CONCAT22((_Var1._M_head_impl[(ushort)(uVar16 - (uVar16 >> 8)) >> 4] >>
                                      8) + _Var1._M_head_impl[(ushort)(uVar16 - (uVar16 >> 8)) >> 4]
                                      ,(_Var1._M_head_impl
                                        [(ushort)((ushort)local_40.rgba -
                                                 ((ushort)local_40.rgba >> 8)) >> 4] >> 8) +
                                       _Var1._M_head_impl
                                       [(ushort)((ushort)local_40.rgba -
                                                ((ushort)local_40.rgba >> 8)) >> 4])));
    }
    if (clip == (QClipData *)0x0) {
      if (0 < mapHeight) {
        dest = (quint32 *)
               (rasterBuffer->m_buffer + (long)x * 4 + (long)y * rasterBuffer->bytes_per_line);
        iVar7 = mapHeight + 1;
        do {
          qt_alphamapblit_argb32_oneline(map,mapWidth,&local_40,dest,c,colorProfile);
          map = map + mapStride;
          iVar7 = iVar7 + -1;
          dest = dest + (int)(uVar8 >> 2);
        } while (1 < iVar7);
      }
    }
    else {
      uVar5 = mapHeight + y;
      if (rasterBuffer->m_height <= mapHeight + y) {
        uVar5 = rasterBuffer->m_height;
      }
      uVar9 = 0;
      if (0 < y) {
        uVar9 = y;
      }
      QClipData::initialize(clip);
      if ((int)uVar9 < (int)uVar5) {
        uVar8 = (ulong)uVar9;
        puVar11 = map + (int)((uVar9 - y) * mapStride);
        do {
          if (0 < clip->m_clipLines[uVar8].count) {
            lVar2 = rasterBuffer->bytes_per_line;
            puVar3 = rasterBuffer->m_buffer;
            pCVar14 = clip->m_clipLines + uVar8;
            lVar13 = 4;
            lVar10 = 0;
            do {
              pQVar4 = pCVar14->spans;
              iVar7 = *(int *)((long)pQVar4 + lVar13 + -4);
              iVar6 = x;
              if (x < iVar7) {
                iVar6 = iVar7;
              }
              iVar7 = iVar7 + *(int *)((long)&pQVar4->x + lVar13);
              iVar12 = mapWidth + x;
              if (iVar7 <= mapWidth + x) {
                iVar12 = iVar7;
              }
              qt_alphamapblit_argb32_oneline
                        (puVar11 + ((long)iVar6 - (long)x),iVar12 - iVar6,&local_40,
                         (quint32 *)(puVar3 + (long)iVar6 * 4 + lVar2 * uVar8),c,colorProfile);
              lVar10 = lVar10 + 1;
              lVar13 = lVar13 + 0x10;
            } while (lVar10 < pCVar14->count);
          }
          puVar11 = puVar11 + mapStride;
          uVar8 = uVar8 + 1;
        } while (uVar8 != uVar5);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void qt_alphamapblit_argb32(QRasterBuffer *rasterBuffer,
                                   int x, int y, const QRgba64 &color,
                                   const uchar *map,
                                   int mapWidth, int mapHeight, int mapStride,
                                   const QClipData *clip, bool useGammaCorrection)
{
    const quint32 c = color.toArgb32();
    const int destStride = rasterBuffer->stride<quint32>();

    if (color.isTransparent())
        return;

    const QColorTrcLut *colorProfile = nullptr;

    if (useGammaCorrection)
        colorProfile = QGuiApplicationPrivate::instance()->colorProfileForA8Text();

    QRgba64 srcColor = color;
    if (colorProfile && color.isOpaque())
        srcColor = colorProfile->toLinear(srcColor);

    if (!clip) {
        quint32 *dest = reinterpret_cast<quint32*>(rasterBuffer->scanLine(y)) + x;
        while (--mapHeight >= 0) {
            qt_alphamapblit_argb32_oneline(map, mapWidth, srcColor, dest, c, colorProfile);
            dest += destStride;
            map += mapStride;
        }
    } else {
        int bottom = qMin(y + mapHeight, rasterBuffer->height());

        int top = qMax(y, 0);
        map += (top - y) * mapStride;

        const_cast<QClipData *>(clip)->initialize();
        for (int yp = top; yp<bottom; ++yp) {
            const QClipData::ClipLine &line = clip->m_clipLines[yp];

            quint32 *dest = reinterpret_cast<quint32 *>(rasterBuffer->scanLine(yp));

            for (int i=0; i<line.count; ++i) {
                const QT_FT_Span &clip = line.spans[i];
                int start = qMax<int>(x, clip.x);
                int end = qMin<int>(x + mapWidth, clip.x + clip.len);
                qt_alphamapblit_argb32_oneline(map + start - x, end - start, srcColor, dest + start, c, colorProfile);
            } // for (yp -> bottom)
            map += mapStride;
        }
    }
}